

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::write_properties(Fl_Widget_Type *this)

{
  float *pfVar1;
  float fVar2;
  Fl_Image *pFVar3;
  Fl_Widget *pFVar4;
  Fl_Type *pFVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int n;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  Fl_Color c;
  int s;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  Fl_Font f;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  Fl_Type::write_properties(&this->super_Fl_Type);
  write_indent((this->super_Fl_Type).level + 1);
  if (this->public_ == 0) {
    pcVar8 = "private";
LAB_00188b3c:
    write_string(pcVar8);
  }
  else if (this->public_ == 2) {
    pcVar8 = "protected";
    goto LAB_00188b3c;
  }
  if ((this->tooltip_ != (char *)0x0) && (*this->tooltip_ != '\0')) {
    write_string("tooltip");
    write_word(this->tooltip_);
  }
  if ((this->image_name_ != (char *)0x0) && (*this->image_name_ != '\0')) {
    write_string("image");
    write_word(this->image_name_);
  }
  if ((this->inactive_name_ != (char *)0x0) && (*this->inactive_name_ != '\0')) {
    write_string("deimage");
    write_word(this->inactive_name_);
  }
  pFVar4 = this->o;
  write_string("xywh {%d %d %d %d}",(ulong)(uint)pFVar4->x_,(ulong)(uint)pFVar4->y_,
               (ulong)(uint)pFVar4->w_,(ulong)(uint)pFVar4->h_);
  pFVar5 = (this->super_Fl_Type).factory[1].prev;
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if ((((iVar6 != 0) &&
       (lVar9 = 0x134, *(char *)((long)&this->o[2].label_.deimage + 4) != pFVar5[2].rtti)) ||
      (lVar9 = 0x6c, this->o->type_ != (uchar)pFVar5->header_position)) ||
     (iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this), iVar6 != 0)) {
    write_string("type");
    iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2c])(this);
    pcVar8 = item_name((Fl_Menu_Item *)CONCAT44(extraout_var,iVar6),
                       (uint)*(byte *)((long)&this->o->_vptr_Fl_Widget + lVar9));
    write_word(pcVar8);
  }
  if (this->o->box_ != *(uchar *)((long)&pFVar5->header_position + 2)) {
    pcVar8 = (char *)0x0;
    write_string("box");
    uVar7 = (ulong)this->o->box_;
    uVar10 = 1000;
    if (uVar7 != 0) {
      uVar10 = uVar7;
    }
    lVar9 = 0x18;
    do {
      if (uVar10 == *(ulong *)((long)&boxmenu[0].text + lVar9)) {
        pcVar8 = *(char **)(item_name::buffer + lVar9 + 8);
        break;
      }
      lVar9 = lVar9 + 0x38;
    } while (lVar9 != 0xd70);
    write_word(pcVar8);
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
  if ((iVar6 != 0) && (*(int *)((long)&this->o[1].label_.value + 4) != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
  if ((iVar6 != 0) && (this->o[2].color_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
  if ((iVar6 != 0) && (this->o[3].w_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
  if (iVar6 == 0) {
    iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
    iVar6 = strcmp((char *)CONCAT44(extraout_var_00,iVar6),"Fl_Input_Choice");
    if (iVar6 == 0) {
      pFVar4 = this->o;
      if (pFVar4[1].label_.value[0x89] != '\0') {
        pcVar8 = (char *)0x0;
        write_string("down_box");
        uVar7 = (ulong)(byte)pFVar4[1].label_.value[0x89];
        uVar10 = 1000;
        if (uVar7 != 0) {
          uVar10 = uVar7;
        }
        lVar9 = 0x18;
        do {
          if (uVar10 == *(ulong *)((long)&boxmenu[0].text + lVar9)) goto LAB_00188f17;
          lVar9 = lVar9 + 0x38;
        } while (lVar9 != 0xd70);
        goto LAB_00188f1c;
      }
    }
    else {
      iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
      if ((iVar6 != 0) && (pFVar4 = this->o, *(char *)((long)&pFVar4[1].callback_ + 1) != '\0')) {
        pcVar8 = (char *)0x0;
        write_string("down_box");
        uVar7 = (ulong)*(byte *)((long)&pFVar4[1].callback_ + 1);
        uVar10 = 1000;
        if (uVar7 != 0) {
          uVar10 = uVar7;
        }
        lVar9 = 0x18;
        do {
          if (uVar10 == *(ulong *)((long)&boxmenu[0].text + lVar9)) goto LAB_00188f17;
          lVar9 = lVar9 + 0x38;
        } while (lVar9 != 0xd70);
LAB_00188f1c:
        write_word(pcVar8);
      }
    }
  }
  else {
    pFVar4 = this->o;
    if (*(char *)((long)&pFVar4[1]._vptr_Fl_Widget + 6) != '\0') {
      pcVar8 = (char *)0x0;
      write_string("down_box");
      uVar7 = (ulong)*(byte *)((long)&pFVar4[1]._vptr_Fl_Widget + 6);
      uVar10 = 1000;
      if (uVar7 != 0) {
        uVar10 = uVar7;
      }
      lVar9 = 0x18;
      do {
        if (uVar10 == *(ulong *)((long)&boxmenu[0].text + lVar9)) {
          pcVar8 = *(char **)(item_name::buffer + lVar9 + 8);
          break;
        }
        lVar9 = lVar9 + 0x38;
      } while (lVar9 != 0xd70);
      write_word(pcVar8);
    }
    if (*(int *)&pFVar4[1]._vptr_Fl_Widget != 0) {
      write_string("shortcut 0x%x");
    }
    if (*(char *)((long)&pFVar4[1]._vptr_Fl_Widget + 4) != '\0') {
      write_string("value 1");
    }
  }
  if (this->o->color_ != *(Fl_Color *)((long)&pFVar5->factory + 4)) {
    write_string("color %d");
  }
  if (this->o->color2_ != pFVar5->code_position) {
    write_string("selection_color %d");
  }
  if ((this->o->label_).type != *(uchar *)&pFVar5->prev) {
    write_string("labeltype");
    pcVar8 = item_name(labeltypemenu,(uint)(this->o->label_).type);
    write_word(pcVar8);
  }
  if ((this->o->label_).font != pFVar5->level) {
    write_string("labelfont %d");
  }
  if ((this->o->label_).size != *(int *)&pFVar5->field_0x4c) {
    write_string("labelsize %d");
  }
  if ((this->o->label_).color != *(Fl_Color *)&pFVar5->next) {
    write_string("labelcolor %d");
  }
  if ((this->o->label_).align_ != *(Fl_Align *)((long)&pFVar5->next + 4)) {
    write_string("align %d");
  }
  if (this->o->when_ != *(uchar *)((long)&pFVar5->header_position + 3)) {
    write_string("when %d");
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
  if (iVar6 != 0) {
    pFVar4 = this->o;
    if (((double)pFVar4[1].callback_ != (double)pFVar5[1].label_) ||
       (NAN((double)pFVar4[1].callback_) || NAN((double)pFVar5[1].label_))) {
      write_string("minimum %g");
    }
    if (((double)pFVar4[1].user_data_ != (double)pFVar5[1].callback_) ||
       (NAN((double)pFVar4[1].user_data_) || NAN((double)pFVar5[1].callback_))) {
      write_string("maximum %g");
    }
    dVar12 = *(double *)&pFVar4[1].x_ / (double)pFVar4[1].w_;
    dVar13 = (double)pFVar5[1].user_data_ / (double)*(int *)&pFVar5[1].user_data_type_;
    if ((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) {
      write_string("step %g");
    }
    if (((double)pFVar4[1]._vptr_Fl_Widget != 0.0) || (NAN((double)pFVar4[1]._vptr_Fl_Widget))) {
      write_string("value %g");
    }
    iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (1 < iVar6) {
      fVar2 = (float)pFVar4[1].h_;
      pfVar1 = (float *)((long)&pFVar5[1].user_data_type_ + 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        write_string("slider_size %g",(double)fVar2);
      }
    }
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if (iVar6 != 0) {
    pFVar4 = this->o;
    pcVar8 = pFVar4[1].label_.value;
    if (((double)pcVar8 != (double)pFVar5[1].comment_) ||
       (NAN((double)pcVar8) || NAN((double)pFVar5[1].comment_))) {
      write_string("minimum %g");
    }
    pFVar3 = pFVar4[1].label_.image;
    if (((double)pFVar3 != (double)pFVar5[1].parent) ||
       (NAN((double)pFVar3) || NAN((double)pFVar5[1].parent))) {
      write_string("maximum %g");
    }
    pFVar3 = pFVar4[1].label_.deimage;
    if (((double)pFVar3 != *(double *)&pFVar5[1].new_selected) ||
       (NAN((double)pFVar3) || NAN(*(double *)&pFVar5[1].new_selected))) {
      write_string("step %g");
    }
    if ((*(double *)&pFVar4[1].w_ != 1.0) || (NAN(*(double *)&pFVar4[1].w_))) {
      write_string("value %g");
    }
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&local_28,&local_2c,&local_30);
  if (iVar6 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&local_24,&local_34,&local_38);
    if (local_24 != local_28) {
      write_string("textfont %d");
    }
    if (local_34 != local_2c) {
      write_string("textsize %d");
    }
    if (local_38 != local_30) {
      write_string("textcolor %d");
    }
  }
  if ((this->o->flags_ & 2) != 0) {
    write_string("hide");
  }
  if ((this->o->flags_ & 1) != 0) {
    write_string("deactivate");
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
  pFVar4 = this->o;
  if (iVar6 == 0) {
    if (pFVar4->parent_ == (Fl_Group *)0x0) goto LAB_001892e5;
    bVar11 = pFVar4->parent_->resizable_ == pFVar4;
  }
  else {
    bVar11 = pFVar4[1].callback_ != (Fl_Callback *)0x0;
  }
  if (bVar11) {
    write_string("resizable");
  }
LAB_001892e5:
  if (this->hotspot_ != '\0') {
    iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
    pcVar8 = "divider";
    if (iVar6 == 0) {
      pcVar8 = "hotspot";
    }
    write_string(pcVar8);
  }
  uVar10 = 0;
  do {
    if (this->extra_code_[uVar10] != (char *)0x0) {
      write_indent((this->super_Fl_Type).level + 1);
      write_string("code%d",uVar10 & 0xffffffff);
      write_word(this->extra_code_[uVar10]);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  if (this->subclass_ != (char *)0x0) {
    write_indent((this->super_Fl_Type).level + 1);
    write_string("class");
    write_word(this->subclass_);
  }
  return;
LAB_00188f17:
  pcVar8 = *(char **)(item_name::buffer + lVar9 + 8);
  goto LAB_00188f1c;
}

Assistant:

void Fl_Widget_Type::write_properties() {
  Fl_Type::write_properties();
  write_indent(level+1);
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: break;
    case 2: write_string("protected"); break;
  }
  if (tooltip() && *tooltip()) {
    write_string("tooltip");
    write_word(tooltip());
  }
  if (image_name() && *image_name()) {
    write_string("image");
    write_word(image_name());
  }
  if (inactive_name() && *inactive_name()) {
    write_string("deimage");
    write_word(inactive_name());
  }
  write_string("xywh {%d %d %d %d}", o->x(), o->y(), o->w(), o->h());
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type()) {
    write_string("type");
    write_word(item_name(subtypes(), ((Fl_Spinner*)o)->type()));
  } else if (o->type() != tplate->type() || is_window()) {
    write_string("type");
    write_word(item_name(subtypes(), o->type()));
  }
  if (o->box() != tplate->box()) {
    write_string("box"); write_word(boxname(o->box()));}
  if (is_input()) {
    Fl_Input_* b = (Fl_Input_*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_value_input()) {
    Fl_Value_Input* b = (Fl_Value_Input*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_text_display()) {
    Fl_Text_Display* b = (Fl_Text_Display*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
    if (b->value()) write_string("value 1");
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  }
  if (o->color()!=tplate->color())
    write_string("color %d", o->color());
  if (o->selection_color()!=tplate->selection_color())
    write_string("selection_color %d", o->selection_color());
  if (o->labeltype()!=tplate->labeltype()) {
    write_string("labeltype");
    write_word(item_name(labeltypemenu, o->labeltype()));
  }
  if (o->labelfont()!=tplate->labelfont())
    write_string("labelfont %d", o->labelfont());
  if (o->labelsize()!=tplate->labelsize())
    write_string("labelsize %d", o->labelsize());
  if (o->labelcolor()!=tplate->labelcolor())
    write_string("labelcolor %d", o->labelcolor());
  if (o->align()!=tplate->align())
    write_string("align %d", o->align());
  if (o->when() != tplate->when())
    write_string("when %d", o->when());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=0.0) write_string("value %g",v->value());
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_string("slider_size %g", x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=1.0) write_string("value %g",v->value());
  }
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}
  if (!o->visible()) write_string("hide");
  if (!o->active()) write_string("deactivate");
  if (resizable()) write_string("resizable");
  if (hotspot()) write_string(is_menu_item() ? "divider" : "hotspot");
  for (int n=0; n < NUM_EXTRA_CODE; n++) if (extra_code(n)) {
    write_indent(level+1);
    write_string("code%d",n);
    write_word(extra_code(n));
  }
  if (subclass()) {
    write_indent(level+1);
    write_string("class");
    write_word(subclass());
  }
}